

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopll.c
# Opt level: O1

void NOPLL_Reset(opll_t *chip,uint32_t chip_type,uint32_t rate,uint32_t clock)

{
  int iVar1;
  opll_patch_t *poVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  memset(chip,0,0x8200);
  chip->clock = clock;
  chip->smplRate = rate;
  chip->chip_type = chip_type;
  if (chip_type - 3 < 2) {
    poVar2 = patch_ymf281;
  }
  else if (chip_type == 6) {
    poVar2 = patch_ym2423;
  }
  else if (chip_type == 1) {
    chip->rhythm = ' ';
    chip->rm_enable = -0x80;
    poVar2 = patch_ds1001;
  }
  else {
    poVar2 = patch_ym2413;
  }
  chip->patchrom = poVar2;
  builtin_memcpy(chip->eg_state,
                 "\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03\x03",0x12);
  builtin_memcpy(chip->eg_level,
                 "\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f\x7f",0x12);
  chip->eg_out = '\x7f';
  lVar3 = 0x12;
  do {
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  chip->rm_select = 6;
  iVar1 = (int)(((ulong)rate * 0x12000) / (ulong)clock);
  uVar4 = iVar1 - 0x400;
  uVar6 = -uVar4;
  if (0 < (int)uVar4) {
    uVar6 = uVar4;
  }
  iVar5 = 0x400;
  if (1 < uVar6) {
    iVar5 = iVar1;
  }
  chip->rateratio = iVar5;
  return;
}

Assistant:

void NOPLL_Reset(opll_t *chip, uint32_t chip_type, uint32_t rate, uint32_t clock) {
    uint32_t i;
    memset(chip, 0, sizeof(opll_t));
    chip->clock = clock;
    chip->smplRate = rate;
    chip->chip_type = chip_type;
    if (chip_type == opll_type_ds1001) {
        /* Rhythm mode is always on */
        chip->rhythm = 0x20;
        chip->rm_enable = (int8_t)0x80;
    }
    switch (chip_type) {
    case opll_type_ds1001:
        chip->patchrom = patch_ds1001;
        break;
    case opll_type_ymf281:
    case opll_type_ymf281b:
        chip->patchrom = patch_ymf281;
        break;
    case opll_type_ym2423:
        chip->patchrom = patch_ym2423;
        break;
    case opll_type_ym2413:
    case opll_type_ym2413b:
    case opll_type_ym2420:
    default:
        chip->patchrom = patch_ym2413;
        break;
    }
    for (i = 0; i < 18; i++) {
        chip->eg_state[i] = eg_num_release;
        chip->eg_level[i] = 0x7f;
        chip->eg_out = 0x7f;
    }
    chip->rm_select = rm_num_tc + 1;

    // ratio: sampleRate / (clock / 72) * (1 << resamplerFraction)
    chip->rateratio = (int32_t)((((uint64_t)72 * chip->smplRate) << RSM_FRAC) / chip->clock);
    if (abs(chip->rateratio - (1 << RSM_FRAC)) <= 1)
        chip->rateratio = (1 << RSM_FRAC);
}